

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure::~IfcRelContainedInSpatialStructure
          (IfcRelContainedInSpatialStructure *this,void **vtt)

{
  void **vtt_local;
  IfcRelContainedInSpatialStructure *this_local;
  
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper = (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
            (long)(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper[-3])
       = vtt[0x12];
  *(void **)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x88 = vtt[0x13]
  ;
  *(void **)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x98 = vtt[0x14]
  ;
  *(void **)&(this->super_IfcRelConnects).super_IfcRelationship.field_0xa8 = vtt[0x15];
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>,_1UL,_0UL>::~ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>,_1UL,_0UL> *)
             &(this->super_IfcRelConnects).field_0xb8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure,_2UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure,_2UL> *)
             &(this->super_IfcRelConnects).super_IfcRelationship.field_0xa8,vtt + 0x10);
  IfcRelConnects::~IfcRelConnects(&this->super_IfcRelConnects,vtt + 1);
  return;
}

Assistant:

IfcRelContainedInSpatialStructure() : Object("IfcRelContainedInSpatialStructure") {}